

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O1

uint GFMulHelper<unsigned_int,_32,_LFSR<BitsInt<unsigned_int,_32>,_141U>,_BitsInt<unsigned_int,_32>,_14>
     ::Run(uint *a,uint *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 unaff_EBX;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  uVar1 = *a;
  uVar4 = (int)uVar1 >> 0x1f & 0x8dU ^ uVar1 * 2;
  uVar2 = uVar4 * 2;
  uVar8 = (int)(uVar1 * 2) >> 0x1f & 0x8dU ^ uVar2;
  uVar3 = uVar8 * 2;
  uVar10 = (int)uVar2 >> 0x1f & 0x8dU ^ uVar3;
  uVar9 = uVar10 * 2;
  uVar11 = (int)uVar3 >> 0x1f & 0x8dU ^ uVar9;
  uVar2 = uVar11 * 2;
  uVar12 = (int)uVar9 >> 0x1f & 0x8dU ^ uVar2;
  uVar3 = uVar12 * 2;
  uVar16 = (int)uVar2 >> 0x1f & 0x8dU ^ uVar3;
  uVar2 = uVar16 * 2;
  uVar13 = (int)uVar3 >> 0x1f & 0x8dU ^ uVar2;
  uVar3 = uVar13 * 2;
  uVar5 = (int)uVar2 >> 0x1f & 0x8dU ^ uVar3;
  uVar9 = (int)uVar3 >> 0x1f & 0x8dU ^ uVar5 * 2;
  uVar2 = uVar9 * 2;
  uVar15 = (int)(uVar5 * 2) >> 0x1f & 0x8dU ^ uVar2;
  uVar14 = uVar15 * 2;
  uVar7 = (int)uVar2 >> 0x1f & 0x8dU ^ uVar14;
  uVar2 = *b;
  auVar17._4_4_ = uVar2;
  auVar17._0_4_ = uVar2;
  auVar17._8_4_ = uVar2;
  auVar17._12_4_ = uVar2;
  auVar18 = _DAT_00fdaba0 & auVar17;
  auVar19._0_4_ = -(uint)(auVar18._0_4_ == 0);
  auVar19._4_4_ = -(uint)(auVar18._4_4_ == 0);
  auVar19._8_4_ = -(uint)(auVar18._8_4_ == 0);
  auVar19._12_4_ = -(uint)(auVar18._12_4_ == 0);
  uVar6 = movmskps(unaff_EBX,auVar19);
  uVar3 = uVar7;
  if ((uVar6 & 8) != 0) {
    uVar3 = 0;
  }
  if ((uVar6 & 4) != 0) {
    uVar15 = 0;
  }
  if ((uVar6 & 2) != 0) {
    uVar9 = 0;
  }
  if ((uVar6 & 1) != 0) {
    uVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar7 = uVar7 * 2;
    uVar14 = (int)uVar14 >> 0x1f & 0x8dU ^ uVar7;
    auVar18 = auVar17 & _DAT_00fdabb0;
    auVar17 = auVar17 & _DAT_00fdabc0;
    return uVar5 ^ uVar9 ^ uVar15 ^
           -(uint)(auVar18._12_4_ == DAT_00fdabb0._12_4_) & uVar10 ^
           -(uint)(auVar17._12_4_ == DAT_00fdabc0._12_4_) & uVar13 ^
           -(uint)(auVar18._4_4_ == DAT_00fdabb0._4_4_) & uVar4 ^
           -(uint)(auVar17._4_4_ == DAT_00fdabc0._4_4_) & uVar12 ^
           -(uint)(auVar18._8_4_ == DAT_00fdabb0._8_4_) & uVar8 ^
           -(uint)(auVar17._8_4_ == DAT_00fdabc0._8_4_) & uVar16 ^
           -(uint)(auVar18._0_4_ == (int)DAT_00fdabb0) & uVar1 ^
           -(uint)(auVar17._0_4_ == (int)DAT_00fdabc0) & uVar11 ^
           uVar3 ^ (int)(uVar2 * 2) >> 0x1f & uVar14 ^
           (int)uVar2 >> 0x1f & ((int)uVar7 >> 0x1f & 0x8dU ^ uVar14 * 2);
  }
  __stack_chk_fail();
}

Assistant:

static inline constexpr I Call(const I& a) {
        return F::template CondXorWith<MOD>(F::Shift(a, 1), F::template TopBits<1>(a));
    }